

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_tests.cc
# Opt level: O0

bool __thiscall
lf::assemble::test::BoundaryAssembler::isActive(BoundaryAssembler *this,Entity *edge)

{
  int iVar1;
  runtime_error *this_00;
  uint *puVar2;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  Entity *local_18;
  Entity *edge_local;
  BoundaryAssembler *this_local;
  
  local_18 = edge;
  edge_local = (Entity *)this;
  iVar1 = (**edge->_vptr_Entity)();
  if (iVar1 != 1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"Argument must be edge");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"edge.Codim() == 1",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
               ,&local_1f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d0,&local_1f8,0x1ff,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this code should not be reached");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar2 = lf::mesh::utils::CodimMeshDataSet<unsigned_int>::operator()
                     (&this->cells_at_edges_,local_18);
  return *puVar2 == 1;
}

Assistant:

bool BoundaryAssembler::isActive(const lf::mesh::Entity &edge) {
  LF_VERIFY_MSG(edge.Codim() == 1, "Argument must be edge");
  return (cells_at_edges_(edge) == 1);
}